

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

AttConfig * __thiscall QPDFJob::AttConfig::moddate(AttConfig *this,string *parameter)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *parameter_local;
  AttConfig *this_local;
  
  local_18 = parameter;
  parameter_local = (string *)this;
  bVar1 = QUtil::pdf_time_to_qpdf_time(parameter,(QPDFTime *)0x0);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_58,(string *)local_18);
    std::operator+(&local_38,&local_58," is not a valid PDF timestamp");
    usage(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::operator=((string *)&(this->att).moddate,(string *)local_18);
  return this;
}

Assistant:

QPDFJob::AttConfig*
QPDFJob::AttConfig::moddate(std::string const& parameter)
{
    if (!QUtil::pdf_time_to_qpdf_time(parameter)) {
        usage(std::string(parameter) + " is not a valid PDF timestamp");
    }
    this->att.moddate = parameter;
    return this;
}